

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_ConvertWif_error_Test::~Privkey_ConvertWif_error_Test(Privkey_ConvertWif_error_Test *this)

{
  Privkey_ConvertWif_error_Test *this_local;
  
  ~Privkey_ConvertWif_error_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_error) {
  try {
    Privkey privkey;
    std::string wif = privkey.ConvertWif(NetType::kMainnet, false);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Error Private key to WIF.");
    return;
  }
  ASSERT_TRUE(false);
}